

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.c
# Opt level: O3

stumpless_param * stumpless_get_param_by_name(stumpless_element *element,char *name)

{
  _Bool _Var1;
  int iVar2;
  char *message;
  ulong uVar3;
  stumpless_param *param;
  size_t name_length;
  size_t local_30;
  
  if (element == (stumpless_element *)0x0) {
    message = "element was NULL";
  }
  else {
    if (name != (char *)0x0) {
      _Var1 = validate_param_name(name,&local_30);
      if (!_Var1) {
        return (stumpless_param *)0x0;
      }
      clear_error();
      pthread_lock_mutex((pthread_mutex_t *)element->mutex);
      if (element->param_count != 0) {
        uVar3 = 0;
        do {
          param = element->params[uVar3];
          lock_param(param);
          iVar2 = strcmp(param->name,name);
          unlock_param(param);
          if (iVar2 == 0) goto LAB_0010accb;
          uVar3 = uVar3 + 1;
        } while (uVar3 < element->param_count);
      }
      raise_param_not_found();
      param = (stumpless_param *)0x0;
LAB_0010accb:
      pthread_unlock_mutex((pthread_mutex_t *)element->mutex);
      return param;
    }
    message = "name was NULL";
  }
  raise_argument_empty(message);
  return (stumpless_param *)0x0;
}

Assistant:

struct stumpless_param *
stumpless_get_param_by_name( const struct stumpless_element *element,
                             const char *name ) {
  size_t name_length;
  size_t i;
  struct stumpless_param *param;
  int cmp_result;

  VALIDATE_ARG_NOT_NULL( element );
  VALIDATE_ARG_NOT_NULL( name );

  if( unlikely( !validate_param_name( name, &name_length ) ) ) {
    return NULL;
  }

  clear_error(  );
  lock_element( element );
  FOR_EACH_PARAM_WITH_NAME( element, name )
    goto cleanup_and_return;
  }